

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void __thiscall
gflags::anon_unknown_2::CommandLineFlag::CopyFrom(CommandLineFlag *this,CommandLineFlag *src)

{
  bool bVar1;
  
  if (this->modified_ != src->modified_) {
    this->modified_ = src->modified_;
  }
  bVar1 = FlagValue::Equal(this->current_,src->current_);
  if (!bVar1) {
    FlagValue::CopyFrom(this->current_,src->current_);
  }
  bVar1 = FlagValue::Equal(this->defvalue_,src->defvalue_);
  if (!bVar1) {
    FlagValue::CopyFrom(this->defvalue_,src->defvalue_);
  }
  if (this->validate_fn_proto_ != src->validate_fn_proto_) {
    this->validate_fn_proto_ = src->validate_fn_proto_;
  }
  return;
}

Assistant:

void CommandLineFlag::CopyFrom(const CommandLineFlag& src) {
  // Note we only copy the non-const members; others are fixed at construct time
  if (modified_ != src.modified_) modified_ = src.modified_;
  if (!current_->Equal(*src.current_)) current_->CopyFrom(*src.current_);
  if (!defvalue_->Equal(*src.defvalue_)) defvalue_->CopyFrom(*src.defvalue_);
  if (validate_fn_proto_ != src.validate_fn_proto_)
    validate_fn_proto_ = src.validate_fn_proto_;
}